

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::set_key(CImgDisplay *this)

{
  X11_info *pXVar1;
  
  memset(this->_keys,0,0x400);
  this->_is_keyPADDIV = false;
  this->_is_keyPADMUL = this->_is_keyPADDIV;
  this->_is_keyPADSUB = this->_is_keyPADMUL;
  this->_is_keyPADADD = this->_is_keyPADSUB;
  this->_is_keyPAD9 = this->_is_keyPADADD;
  this->_is_keyPAD8 = this->_is_keyPAD9;
  this->_is_keyPAD7 = this->_is_keyPAD8;
  this->_is_keyPAD6 = this->_is_keyPAD7;
  this->_is_keyPAD5 = this->_is_keyPAD6;
  this->_is_keyPAD4 = this->_is_keyPAD5;
  this->_is_keyPAD3 = this->_is_keyPAD4;
  this->_is_keyPAD2 = this->_is_keyPAD3;
  this->_is_keyPAD1 = this->_is_keyPAD2;
  this->_is_keyPAD0 = this->_is_keyPAD1;
  this->_is_keyARROWRIGHT = this->_is_keyPAD0;
  this->_is_keyARROWDOWN = this->_is_keyARROWRIGHT;
  this->_is_keyARROWLEFT = this->_is_keyARROWDOWN;
  this->_is_keyCTRLRIGHT = this->_is_keyARROWLEFT;
  this->_is_keyMENU = this->_is_keyCTRLRIGHT;
  this->_is_keyAPPRIGHT = this->_is_keyMENU;
  this->_is_keyALTGR = this->_is_keyAPPRIGHT;
  this->_is_keySPACE = this->_is_keyALTGR;
  this->_is_keyALT = this->_is_keySPACE;
  this->_is_keyAPPLEFT = this->_is_keyALT;
  this->_is_keyCTRLLEFT = this->_is_keyAPPLEFT;
  this->_is_keyARROWUP = this->_is_keyCTRLLEFT;
  this->_is_keySHIFTRIGHT = this->_is_keyARROWUP;
  this->_is_keyM = this->_is_keySHIFTRIGHT;
  this->_is_keyN = this->_is_keyM;
  this->_is_keyB = this->_is_keyN;
  this->_is_keyV = this->_is_keyB;
  this->_is_keyC = this->_is_keyV;
  this->_is_keyX = this->_is_keyC;
  this->_is_keyZ = this->_is_keyX;
  this->_is_keySHIFTLEFT = this->_is_keyZ;
  this->_is_keyENTER = this->_is_keySHIFTLEFT;
  this->_is_keyL = this->_is_keyENTER;
  this->_is_keyK = this->_is_keyL;
  this->_is_keyJ = this->_is_keyK;
  this->_is_keyH = this->_is_keyJ;
  this->_is_keyG = this->_is_keyH;
  this->_is_keyF = this->_is_keyG;
  this->_is_keyD = this->_is_keyF;
  this->_is_keyS = this->_is_keyD;
  this->_is_keyA = this->_is_keyS;
  this->_is_keyCAPSLOCK = this->_is_keyA;
  this->_is_keyPAGEDOWN = this->_is_keyCAPSLOCK;
  this->_is_keyEND = this->_is_keyPAGEDOWN;
  this->_is_keyDELETE = this->_is_keyEND;
  this->_is_keyP = this->_is_keyDELETE;
  this->_is_keyO = this->_is_keyP;
  this->_is_keyI = this->_is_keyO;
  this->_is_keyU = this->_is_keyI;
  this->_is_keyY = this->_is_keyU;
  this->_is_keyT = this->_is_keyY;
  this->_is_keyR = this->_is_keyT;
  this->_is_keyE = this->_is_keyR;
  this->_is_keyW = this->_is_keyE;
  this->_is_keyQ = this->_is_keyW;
  this->_is_keyTAB = this->_is_keyQ;
  this->_is_keyPAGEUP = this->_is_keyTAB;
  this->_is_keyHOME = this->_is_keyPAGEUP;
  this->_is_keyINSERT = this->_is_keyHOME;
  this->_is_keyBACKSPACE = this->_is_keyINSERT;
  this->_is_key0 = this->_is_keyBACKSPACE;
  this->_is_key9 = this->_is_key0;
  this->_is_key8 = this->_is_key9;
  this->_is_key7 = this->_is_key8;
  this->_is_key6 = this->_is_key7;
  this->_is_key5 = this->_is_key6;
  this->_is_key4 = this->_is_key5;
  this->_is_key3 = this->_is_key4;
  this->_is_key2 = this->_is_key3;
  this->_is_key1 = this->_is_key2;
  this->_is_keyPAUSE = this->_is_key1;
  this->_is_keyF12 = this->_is_keyPAUSE;
  this->_is_keyF11 = this->_is_keyF12;
  this->_is_keyF10 = this->_is_keyF11;
  this->_is_keyF9 = this->_is_keyF10;
  this->_is_keyF8 = this->_is_keyF9;
  this->_is_keyF7 = this->_is_keyF8;
  this->_is_keyF6 = this->_is_keyF7;
  this->_is_keyF5 = this->_is_keyF6;
  this->_is_keyF4 = this->_is_keyF5;
  this->_is_keyF3 = this->_is_keyF4;
  this->_is_keyF2 = this->_is_keyF3;
  this->_is_keyF1 = this->_is_keyF2;
  this->_is_keyESC = this->_is_keyF1;
  this->_is_event = true;
  pXVar1 = cimg::X11_attr();
  pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  return this;
}

Assistant:

CImgDisplay& set_key() {
      std::memset((void*)_keys,0,sizeof(_keys));
      std::memset((void*)_released_keys,0,sizeof(_released_keys));
      _is_keyESC = _is_keyF1 = _is_keyF2 = _is_keyF3 = _is_keyF4 = _is_keyF5 = _is_keyF6 = _is_keyF7 = _is_keyF8 = _is_keyF9 =
        _is_keyF10 = _is_keyF11 = _is_keyF12 = _is_keyPAUSE = _is_key1 = _is_key2 = _is_key3 = _is_key4 = _is_key5 = _is_key6 =
        _is_key7 = _is_key8 = _is_key9 = _is_key0 = _is_keyBACKSPACE = _is_keyINSERT = _is_keyHOME = _is_keyPAGEUP = _is_keyTAB =
        _is_keyQ = _is_keyW = _is_keyE = _is_keyR = _is_keyT = _is_keyY = _is_keyU = _is_keyI = _is_keyO = _is_keyP = _is_keyDELETE =
        _is_keyEND = _is_keyPAGEDOWN = _is_keyCAPSLOCK = _is_keyA = _is_keyS = _is_keyD = _is_keyF = _is_keyG = _is_keyH = _is_keyJ =
        _is_keyK = _is_keyL = _is_keyENTER = _is_keySHIFTLEFT = _is_keyZ = _is_keyX = _is_keyC = _is_keyV = _is_keyB = _is_keyN =
        _is_keyM = _is_keySHIFTRIGHT = _is_keyARROWUP = _is_keyCTRLLEFT = _is_keyAPPLEFT = _is_keyALT = _is_keySPACE = _is_keyALTGR = _is_keyAPPRIGHT =
        _is_keyMENU = _is_keyCTRLRIGHT = _is_keyARROWLEFT = _is_keyARROWDOWN = _is_keyARROWRIGHT = _is_keyPAD0 = _is_keyPAD1 = _is_keyPAD2 =
        _is_keyPAD3 = _is_keyPAD4 = _is_keyPAD5 = _is_keyPAD6 = _is_keyPAD7 = _is_keyPAD8 = _is_keyPAD9 = _is_keyPADADD = _is_keyPADSUB =
        _is_keyPADMUL = _is_keyPADDIV = false;
      _is_event = true;
#if cimg_display==1
      pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
      SetEvent(cimg::Win32_attr().wait_event);
#endif
      return *this;
    }